

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonPP.cpp
# Opt level: O0

Value * ccd::Json::arrayFromString(Value *__return_storage_ptr__,string *jsonString)

{
  size_t sVar1;
  bool bVar2;
  Type TVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  reference pcVar7;
  void *this;
  double dVar8;
  allocator<ccd::Json::Value> local_359;
  _List_node_base *local_358;
  move_iterator<std::_List_iterator<ccd::Json::Value>_> local_350;
  _List_node_base *local_348;
  move_iterator<std::_List_iterator<ccd::Json::Value>_> local_340;
  Array local_338;
  string local_320 [35];
  allocator<char> local_2fd;
  undefined1 local_2fc;
  undefined1 local_2fb;
  undefined1 local_2fa;
  undefined1 local_2f9;
  undefined1 *local_2f8;
  undefined8 local_2f0;
  string local_2e8 [35];
  allocator<char> local_2c5;
  undefined1 local_2c4;
  undefined1 local_2c3;
  undefined1 local_2c2;
  undefined1 local_2c1;
  undefined1 *local_2c0;
  undefined8 local_2b8;
  string local_2b0 [32];
  void *local_290;
  bool local_282;
  bool local_281;
  string local_280;
  undefined1 local_260 [8];
  Value value_3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_218;
  char character_1;
  iterator __end7;
  iterator __begin7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range7;
  int closeCount_1;
  int openCount_1;
  size_type newEndPos_1;
  int local_1ac;
  undefined1 local_1a8 [4];
  int value_2;
  double local_188;
  double value_1;
  size_type tempPos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  size_type endOfValue;
  size_type beginOfValue;
  undefined1 local_128 [8];
  Value subObject;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_e0;
  char character;
  iterator __end4;
  iterator __begin4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range4;
  int closeCount;
  int openCount;
  size_type newEndPos;
  size_type newBeginPos;
  long local_88;
  undefined8 local_80;
  string local_78 [32];
  double local_58;
  size_type offset;
  long local_40;
  size_type endPos;
  size_type beginPos;
  list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> arrayValues;
  string *jsonString_local;
  
  arrayValues.super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>._M_impl._M_node.
  _M_size = (size_t)jsonString;
  setlocale(1,"C");
  memset(&beginPos,0,0x18);
  std::__cxx11::list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::list
            ((list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)&beginPos);
  endPos = std::__cxx11::string::find_first_of
                     ((char)arrayValues.
                            super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>.
                            _M_impl._M_node._M_size,0x5b);
  local_40 = std::__cxx11::string::find_last_of
                       ((char)arrayValues.
                              super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>.
                              _M_impl._M_node._M_size,0x5d);
  sVar1 = arrayValues.super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>._M_impl.
          _M_node._M_size;
  if ((endPos == 0xffffffffffffffff) || (local_40 == -1)) {
    poVar5 = std::operator<<((ostream *)&std::cout,"can\'t tell beginning or end of array");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
    offset._0_4_ = 1;
  }
  else {
    local_58 = (double)(endPos + 1);
    newBeginPos._4_1_ = 0x20;
    newBeginPos._5_1_ = 9;
    newBeginPos._6_1_ = 10;
    newBeginPos._7_1_ = 0xd;
    local_88 = (long)&newBeginPos + 4;
    local_80 = 4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,local_88,local_80,(long)&newBeginPos + 3);
    endPos = std::__cxx11::string::find_first_not_of((string *)sVar1,(ulong)local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&newBeginPos + 3));
    while (endPos != 0xffffffffffffffff) {
      local_58 = (double)endPos;
      pcVar6 = (char *)std::__cxx11::string::at
                                 (arrayValues.
                                  super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                  ._M_impl._M_node._M_size);
      if (*pcVar6 == '{') {
        _closeCount = local_58;
        __range4._4_4_ = 0;
        __range4._0_4_ = 0;
        std::__cxx11::string::substr
                  ((ulong)&__begin4,
                   arrayValues.super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                   ._M_impl._M_node._M_size);
        __end4._M_current = (char *)std::__cxx11::string::begin();
        _Stack_e0._M_current = (char *)std::__cxx11::string::end();
        while (bVar2 = __gnu_cxx::operator!=(&__end4,&stack0xffffffffffffff20), bVar2) {
          pcVar7 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&__end4);
          subObject.m_value.
          super__Variant_base<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
          .
          super__Move_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
          .
          super__Copy_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
          .
          super__Move_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
          .
          super__Copy_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
          .
          super__Variant_storage_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
          ._55_1_ = *pcVar7;
          if (subObject.m_value.
              super__Variant_base<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
              .
              super__Move_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
              .
              super__Copy_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
              .
              super__Move_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
              .
              super__Copy_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
              .
              super__Variant_storage_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
              ._55_1_ == '{') {
            __range4._4_4_ = __range4._4_4_ + 1;
          }
          if (subObject.m_value.
              super__Variant_base<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
              .
              super__Move_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
              .
              super__Copy_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
              .
              super__Move_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
              .
              super__Copy_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
              .
              super__Variant_storage_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
              ._55_1_ == '}') {
            __range4._0_4_ = (int)__range4 + 1;
          }
          if (__range4._4_4_ == (int)__range4) break;
          _closeCount = (double)((long)_closeCount + 1);
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end4);
        }
        offset._0_4_ = 4;
        std::__cxx11::string::~string((string *)&__begin4);
        if (__range4._4_4_ != (int)__range4) {
          poVar5 = std::operator<<((ostream *)&std::cout,"could not tell end of new subObject");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
          offset._0_4_ = 1;
          goto LAB_00146583;
        }
        std::__cxx11::string::substr
                  ((ulong)&beginOfValue,
                   arrayValues.super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                   ._M_impl._M_node._M_size);
        objectFromString((Value *)local_128,(string *)&beginOfValue);
        std::__cxx11::string::~string((string *)&beginOfValue);
        TVar3 = Value::type((Value *)local_128);
        if (TVar3 != Null) {
          std::__cxx11::list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::push_back
                    ((list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)&beginPos,
                     (value_type *)local_128);
          local_58 = (double)((long)_closeCount + 1);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cout,"subObject ist nullptr");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
        }
        offset._0_4_ = (uint)(TVar3 == Null);
        Value::~Value((Value *)local_128);
        if ((uint)offset != 0) goto LAB_00146583;
      }
      else {
        pcVar6 = (char *)std::__cxx11::string::at
                                   (arrayValues.
                                    super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                    ._M_impl._M_node._M_size);
        if (*pcVar6 == '\"') {
          value.field_2._8_8_ =
               std::__cxx11::string::find_first_of
                         ((char)arrayValues.
                                super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                ._M_impl._M_node._M_size,0x22);
          if (value.field_2._8_8_ == -1) {
            poVar5 = std::operator<<((ostream *)&std::cout,"cant find end of value");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
            offset._0_4_ = 1;
            goto LAB_00146583;
          }
          std::__cxx11::string::substr
                    ((ulong)&tempPos,
                     arrayValues.
                     super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>._M_impl.
                     _M_node._M_size);
          std::__cxx11::list<ccd::Json::Value,std::allocator<ccd::Json::Value>>::
          emplace_back<std::__cxx11::string>
                    ((list<ccd::Json::Value,std::allocator<ccd::Json::Value>> *)&beginPos,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tempPos);
          local_58 = (double)(value.field_2._8_8_ + 1);
          std::__cxx11::string::~string((string *)&tempPos);
        }
        else {
          pcVar6 = (char *)std::__cxx11::string::at
                                     (arrayValues.
                                      super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                      ._M_impl._M_node._M_size);
          iVar4 = isdigit((int)*pcVar6);
          if ((iVar4 == 0) &&
             (pcVar6 = (char *)std::__cxx11::string::at
                                         (arrayValues.
                                          super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                          ._M_impl._M_node._M_size), *pcVar6 != '-')) {
            pcVar6 = (char *)std::__cxx11::string::at
                                       (arrayValues.
                                        super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                        ._M_impl._M_node._M_size);
            if (*pcVar6 == '[') {
              _closeCount_1 = local_58;
              __range7._4_4_ = 0;
              __range7._0_4_ = 0;
              std::__cxx11::string::substr
                        ((ulong)&__begin7,
                         arrayValues.
                         super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>.
                         _M_impl._M_node._M_size);
              __end7._M_current = (char *)std::__cxx11::string::begin();
              _Stack_218._M_current = (char *)std::__cxx11::string::end();
              while (bVar2 = __gnu_cxx::operator!=(&__end7,&stack0xfffffffffffffde8), bVar2) {
                pcVar7 = __gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&__end7);
                value_3.m_value.
                super__Variant_base<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
                .
                super__Move_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                .
                super__Copy_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                .
                super__Move_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                .
                super__Copy_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                .
                super__Variant_storage_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                ._55_1_ = *pcVar7;
                if (value_3.m_value.
                    super__Variant_base<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
                    .
                    super__Move_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                    .
                    super__Copy_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                    .
                    super__Move_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                    .
                    super__Copy_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                    .
                    super__Variant_storage_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                    ._55_1_ == '[') {
                  __range7._4_4_ = __range7._4_4_ + 1;
                }
                if (value_3.m_value.
                    super__Variant_base<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
                    .
                    super__Move_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                    .
                    super__Copy_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                    .
                    super__Move_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                    .
                    super__Copy_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                    .
                    super__Variant_storage_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                    ._55_1_ == ']') {
                  __range7._0_4_ = (int)__range7 + 1;
                }
                if (__range7._4_4_ == (int)__range7) break;
                _closeCount_1 = (double)((long)_closeCount_1 + 1);
                __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&__end7);
              }
              offset._0_4_ = 10;
              std::__cxx11::string::~string((string *)&__begin7);
              if (__range7._4_4_ != (int)__range7) {
                poVar5 = std::operator<<((ostream *)&std::cout,"could not tell end of new subObject"
                                        );
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
                offset._0_4_ = 1;
                goto LAB_00146583;
              }
              std::__cxx11::string::substr
                        ((ulong)&local_280,
                         arrayValues.
                         super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>.
                         _M_impl._M_node._M_size);
              arrayFromString((Value *)local_260,&local_280);
              std::__cxx11::string::~string((string *)&local_280);
              std::__cxx11::list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::push_back
                        ((list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)&beginPos,
                         (value_type *)local_260);
              local_58 = (double)((long)_closeCount_1 + 1);
              Value::~Value((Value *)local_260);
            }
            else {
              pcVar6 = (char *)std::__cxx11::string::at
                                         (arrayValues.
                                          super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                          ._M_impl._M_node._M_size);
              if (*pcVar6 == ']') break;
              pcVar6 = (char *)std::__cxx11::string::at
                                         (arrayValues.
                                          super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                          ._M_impl._M_node._M_size);
              if (*pcVar6 == 't') {
                iVar4 = std::__cxx11::string::compare
                                  (arrayValues.
                                   super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                   ._M_impl._M_node._M_size,(ulong)local_58,(char *)0x4);
                if (iVar4 == 0) {
                  local_281 = true;
                  std::__cxx11::list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::
                  emplace_back<bool>((list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)
                                     &beginPos,&local_281);
                  local_58 = (double)((long)local_58 + 4);
                }
                else {
                  local_58 = (double)((long)local_58 + 1);
                }
              }
              else {
                pcVar6 = (char *)std::__cxx11::string::at
                                           (arrayValues.
                                            super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                            ._M_impl._M_node._M_size);
                if (*pcVar6 == 'f') {
                  iVar4 = std::__cxx11::string::compare
                                    (arrayValues.
                                     super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                     ._M_impl._M_node._M_size,(ulong)local_58,(char *)0x5);
                  if (iVar4 == 0) {
                    local_282 = false;
                    std::__cxx11::list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::
                    emplace_back<bool>((list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)
                                       &beginPos,&local_282);
                    local_58 = (double)((long)local_58 + 5);
                  }
                  else {
                    local_58 = (double)((long)local_58 + 1);
                  }
                }
                else {
                  pcVar6 = (char *)std::__cxx11::string::at
                                             (arrayValues.
                                              super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                              ._M_impl._M_node._M_size);
                  if (*pcVar6 != 'n') {
                    poVar5 = std::operator<<((ostream *)&std::cout,"invalid value ");
                    pcVar6 = (char *)std::__cxx11::string::at
                                               (arrayValues.
                                                super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                                ._M_impl._M_node._M_size);
                    poVar5 = std::operator<<(poVar5,*pcVar6);
                    poVar5 = std::operator<<(poVar5," offset ");
                    this = (void *)std::ostream::operator<<(poVar5,(ulong)local_58);
                    poVar5 = (ostream *)
                             std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
                    poVar5 = std::operator<<(poVar5,(string *)
                                                    arrayValues.
                                                                                                        
                                                  super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                                  ._M_impl._M_node._M_size);
                    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                    Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
                    offset._0_4_ = 1;
                    goto LAB_00146583;
                  }
                  iVar4 = std::__cxx11::string::compare
                                    (arrayValues.
                                     super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                     ._M_impl._M_node._M_size,(ulong)local_58,(char *)0x4);
                  if (iVar4 == 0) {
                    local_290 = (void *)0x0;
                    std::__cxx11::list<ccd::Json::Value,std::allocator<ccd::Json::Value>>::
                    emplace_back<decltype(nullptr)>
                              ((list<ccd::Json::Value,std::allocator<ccd::Json::Value>> *)&beginPos,
                               &local_290);
                    local_58 = (double)((long)local_58 + 4);
                  }
                  else {
                    local_58 = (double)((long)local_58 + 1);
                  }
                }
              }
            }
          }
          else {
            value_1 = local_58;
            do {
              local_58 = (double)((long)local_58 + 1);
              pcVar6 = (char *)std::__cxx11::string::at
                                         (arrayValues.
                                          super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                          ._M_impl._M_node._M_size);
              iVar4 = isdigit((int)*pcVar6);
            } while (iVar4 != 0);
            pcVar6 = (char *)std::__cxx11::string::at
                                       (arrayValues.
                                        super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                        ._M_impl._M_node._M_size);
            if (*pcVar6 == '.') {
              local_58 = (double)((long)local_58 + 1);
              pcVar6 = (char *)std::__cxx11::string::at
                                         (arrayValues.
                                          super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                          ._M_impl._M_node._M_size);
              iVar4 = isdigit((int)*pcVar6);
              if (iVar4 == 0) {
                poVar5 = std::operator<<((ostream *)&std::cout,"exptected digit");
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
                offset._0_4_ = 1;
                goto LAB_00146583;
              }
              do {
                local_58 = (double)((long)local_58 + 1);
                pcVar6 = (char *)std::__cxx11::string::at
                                           (arrayValues.
                                            super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                            ._M_impl._M_node._M_size);
                iVar4 = isdigit((int)*pcVar6);
              } while (iVar4 != 0);
              std::__cxx11::string::substr
                        ((ulong)local_1a8,
                         arrayValues.
                         super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>.
                         _M_impl._M_node._M_size);
              dVar8 = std::__cxx11::stod((string *)local_1a8,(size_t *)0x0);
              std::__cxx11::string::~string((string *)local_1a8);
              local_188 = dVar8;
              std::__cxx11::list<ccd::Json::Value,std::allocator<ccd::Json::Value>>::
              emplace_back<double&>
                        ((list<ccd::Json::Value,std::allocator<ccd::Json::Value>> *)&beginPos,
                         &local_188);
            }
            else {
              std::__cxx11::string::substr
                        ((ulong)&newEndPos_1,
                         arrayValues.
                         super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>.
                         _M_impl._M_node._M_size);
              iVar4 = std::__cxx11::stoi((string *)&newEndPos_1,(size_t *)0x0,10);
              std::__cxx11::string::~string((string *)&newEndPos_1);
              local_1ac = iVar4;
              std::__cxx11::list<ccd::Json::Value,std::allocator<ccd::Json::Value>>::
              emplace_back<int&>((list<ccd::Json::Value,std::allocator<ccd::Json::Value>> *)
                                 &beginPos,&local_1ac);
            }
          }
        }
      }
      sVar1 = arrayValues.super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>.
              _M_impl._M_node._M_size;
      local_2c4 = 0x20;
      local_2c3 = 9;
      local_2c2 = 10;
      local_2c1 = 0xd;
      local_2c0 = &local_2c4;
      local_2b8 = 4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b0,local_2c0,local_2b8,&local_2c5);
      local_58 = (double)std::__cxx11::string::find_first_not_of((string *)sVar1,(ulong)local_2b0);
      std::__cxx11::string::~string(local_2b0);
      std::allocator<char>::~allocator(&local_2c5);
      pcVar6 = (char *)std::__cxx11::string::at
                                 (arrayValues.
                                  super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                  ._M_impl._M_node._M_size);
      if (*pcVar6 == ']') break;
      pcVar6 = (char *)std::__cxx11::string::at
                                 (arrayValues.
                                  super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                                  ._M_impl._M_node._M_size);
      sVar1 = arrayValues.super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>.
              _M_impl._M_node._M_size;
      if (*pcVar6 != ',') {
        poVar5 = std::operator<<((ostream *)&std::cout,"syntax error!");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::substr
                  ((ulong)local_320,
                   arrayValues.super__List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>
                   ._M_impl._M_node._M_size);
        std::operator<<((ostream *)&std::cout,local_320);
        std::__cxx11::string::~string(local_320);
        Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
        offset._0_4_ = 1;
        goto LAB_00146583;
      }
      local_2fc = 0x20;
      local_2fb = 9;
      local_2fa = 10;
      local_2f9 = 0xd;
      local_2f8 = &local_2fc;
      local_2f0 = 4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,local_2f8,local_2f0,&local_2fd);
      endPos = std::__cxx11::string::find_first_not_of((string *)sVar1,(ulong)local_2e8);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator(&local_2fd);
    }
    local_348 = (_List_node_base *)
                std::begin<std::__cxx11::list<ccd::Json::Value,std::allocator<ccd::Json::Value>>>
                          ((list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)&beginPos);
    local_340 = std::make_move_iterator<std::_List_iterator<ccd::Json::Value>>
                          ((_List_iterator<ccd::Json::Value>)local_348);
    local_358 = (_List_node_base *)
                std::end<std::__cxx11::list<ccd::Json::Value,std::allocator<ccd::Json::Value>>>
                          ((list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)&beginPos);
    local_350 = std::make_move_iterator<std::_List_iterator<ccd::Json::Value>>
                          ((_List_iterator<ccd::Json::Value>)local_358);
    std::allocator<ccd::Json::Value>::allocator(&local_359);
    std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>::
    vector<std::move_iterator<std::_List_iterator<ccd::Json::Value>>,void>
              ((vector<ccd::Json::Value,std::allocator<ccd::Json::Value>> *)&local_338,local_340,
               local_350,&local_359);
    Value::Value(__return_storage_ptr__,&local_338);
    std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::~vector(&local_338);
    std::allocator<ccd::Json::Value>::~allocator(&local_359);
    offset._0_4_ = 1;
  }
LAB_00146583:
  std::__cxx11::list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::~list
            ((list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)&beginPos);
  return __return_storage_ptr__;
}

Assistant:

Value arrayFromString(const std::string& jsonString)
{
	// make shure that decimal delimiter is a dot '.'
	std::setlocale(LC_NUMERIC, "C");

	auto arrayValues = std::list<Value>{};

	// check the borders
	auto beginPos = jsonString.find_first_of('[');
	auto endPos = jsonString.find_last_of(']');

	// if borders can not be defined something is wrong
	if (beginPos == string::npos || endPos == string::npos) {
		cout << "can't tell beginning or end of array" << endl;
		return nullptr;
	}

	// offset is one position after the beginning border
	auto offset = beginPos + 1;

	// find the first character
	beginPos = jsonString.find_first_not_of({ ' ', 9, 10 , 13 }, offset);

	// if no usefull character could be found position is set to npos
	while (beginPos != string::npos) {
		offset = beginPos;
		// it could be ne new sub object
		if (jsonString.at(offset) == '{') {
			auto newBeginPos = offset;
			auto newEndPos = offset;
			auto openCount = 0;
			auto closeCount = 0;

			// find the enclosing curly braces
			for (auto character : jsonString.substr(offset)) {
				if (character == '{')
					openCount++;
				if (character == '}')
					closeCount++;
				// if the count of close and open curly braces is equeal
				// we have found the position of the closing one
				if (openCount == closeCount)
					break;
				newEndPos++;
			}

			// if the count is different there is a syntax error
			if (openCount != closeCount) {
				cout << "could not tell end of new subObject" << endl;
				return nullptr;
			}

			// if everything went right, set the dataName and start a new
			// objectFromJson querry recursively
			auto subObject = objectFromString(jsonString.substr(newBeginPos,
				newEndPos - newBeginPos + 1));
			if (subObject.type() == Value::Type::Null) {
				std::cout << "subObject ist nullptr" << std::endl;
				return nullptr;
			}
			arrayValues.push_back(move(subObject));
			// set the offset to one position after the closing curly braces 
			offset = newEndPos + 1;
		}
		// it could be a string value
		else if (jsonString.at(offset) == '"') {
			// find the value borders
			auto beginOfValue = offset + 1;
			auto endOfValue = jsonString.find_first_of('"', offset + 1);
			if (endOfValue == string::npos) {
				cout << "cant find end of value" << endl;
				return nullptr;
			}

			// save the found value
			auto value = jsonString.substr(beginOfValue, endOfValue - beginOfValue);

			// add the found data to the object struct map
			arrayValues.emplace_back(move(value));

			// set the offset to one position after the end of value
			offset = endOfValue + 1;
		}
		// it could be a numerical value
		else if (isdigit(jsonString.at(offset)) || (jsonString.at(offset) == '-')) {
			auto tempPos = offset;
			offset++;
			while (isdigit(jsonString.at(offset))) {
				offset++;
			}

			if (jsonString.at(offset) == '.') {
				offset++;

				if (!isdigit(jsonString.at(offset))) {
					std::cout << "exptected digit" << std::endl;
					return nullptr;
				}
				offset++;
				while (isdigit(jsonString.at(offset))) {
					offset++;
				}
				//save the found double
				auto value = stod(jsonString.substr(tempPos, offset - tempPos));
				// add the found data to the object struct map
				arrayValues.emplace_back(value);
			}
			else {
				// save the found int
				auto value = stoi(jsonString.substr(tempPos, offset - tempPos));
				// add the found data to the object struct map
				arrayValues.emplace_back(value);
			}
		}
		//it could be an array
		else if (jsonString.at(offset) == '[') {
			
			auto newEndPos = offset;
			auto openCount = 0;
			auto closeCount = 0;

			// find the enclosing curly braces
			for (auto character : jsonString.substr(offset)) {
				if (character == '[')
					openCount++;
				if (character == ']')
					closeCount++;
				// if the count of close and open curly braces is equeal
				// we have found the position of the closing one
				if (openCount == closeCount)
					break;
				newEndPos++;
			}

			// if the count is different there is a syntax error
			if (openCount != closeCount) {
				cout << "could not tell end of new subObject" << endl;
				return nullptr;
			}
			auto value = arrayFromString(jsonString.substr(offset));
			arrayValues.push_back(move(value));

			offset = newEndPos + 1;
		}
		else if (jsonString.at(offset) == ']') {
			break;
		}
		else if (jsonString.at(offset) == 't') {
			if (jsonString.compare(offset, 4, "true") == 0) {
				arrayValues.emplace_back(true);
				offset += 4;
			}
			else
				offset++;
		}
		else if (jsonString.at(offset) == 'f') {
			if (jsonString.compare(offset, 5, "false") == 0) {
				arrayValues.emplace_back(false);
				offset += 5;
			}
			else
				offset++;
		}
		else if (jsonString.at(offset) == 'n') {
			if (jsonString.compare(offset, 4, "null") == 0) {
				arrayValues.emplace_back(nullptr);
				offset += 4;
			}
			else
				offset++;
		}
		else {
			cout 	<< "invalid value " << jsonString.at(offset) 
				<< " offset " << offset << endl
				<< jsonString << std::endl;
			return nullptr;
		}

		// find the next character
		offset = jsonString.find_first_not_of({ ' ', 9, 10 , 13 }, offset);

		// is it a closing curly braces we reached the end of the object and we are done
		if (jsonString.at(offset) == ']')
			break;
		// if a comma is next more values are following
		else if (jsonString.at(offset) == ',') {
			beginPos = jsonString.find_first_not_of({ ' ', 9, 10 , 13 }, offset + 1);
			continue;
		}
		// else syntax error
		else {
			std::cout << "syntax error!" << std::endl;
			std::cout << jsonString.substr(offset);
			return nullptr;
		}
	}

	return Array { 
		std::make_move_iterator(std::begin(arrayValues)),
		std::make_move_iterator(std::end(arrayValues))
	};
}